

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot.cpp
# Opt level: O2

void ImPlot::SetNextPlotLimitsY(double y_min,double y_max,ImGuiCond cond,ImPlotYAxis y_axis)

{
  ImPlotContext *pIVar1;
  
  pIVar1 = GImPlot;
  if (GImPlot->CurrentPlot != (ImPlotPlot *)0x0) {
    __assert_fail("(gp.CurrentPlot == __null) && \"SetNextPlotLimitsY() needs to be called before BeginPlot()!\""
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/libs/imgui/implot.cpp"
                  ,0xa09,"void ImPlot::SetNextPlotLimitsY(double, double, ImGuiCond, ImPlotYAxis)");
  }
  if ((uint)y_axis < 3) {
    if ((cond & cond - 1U) == 0) {
      (GImPlot->NextPlotData).HasYRange[(uint)y_axis] = true;
      (pIVar1->NextPlotData).YRangeCond[(uint)y_axis] = cond;
      (pIVar1->NextPlotData).YRange[(uint)y_axis].Min = y_min;
      (pIVar1->NextPlotData).YRange[(uint)y_axis].Max = y_max;
      return;
    }
    __assert_fail("cond == 0 || ImIsPowerOfTwo(cond)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/libs/imgui/implot.cpp"
                  ,0xa0b,"void ImPlot::SetNextPlotLimitsY(double, double, ImGuiCond, ImPlotYAxis)");
  }
  __assert_fail("(y_axis >= 0 && y_axis < 3) && \"y_axis needs to be between 0 and IMPLOT_Y_AXES\"",
                "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/libs/imgui/implot.cpp"
                ,0xa0a,"void ImPlot::SetNextPlotLimitsY(double, double, ImGuiCond, ImPlotYAxis)");
}

Assistant:

void SetNextPlotLimitsY(double y_min, double y_max, ImGuiCond cond, ImPlotYAxis y_axis) {
    ImPlotContext& gp = *GImPlot;
    IM_ASSERT_USER_ERROR(gp.CurrentPlot == NULL, "SetNextPlotLimitsY() needs to be called before BeginPlot()!");
    IM_ASSERT_USER_ERROR(y_axis >= 0 && y_axis < IMPLOT_Y_AXES, "y_axis needs to be between 0 and IMPLOT_Y_AXES");
    IM_ASSERT(cond == 0 || ImIsPowerOfTwo(cond)); // Make sure the user doesn't attempt to combine multiple condition flags.
    gp.NextPlotData.HasYRange[y_axis] = true;
    gp.NextPlotData.YRangeCond[y_axis] = cond;
    gp.NextPlotData.YRange[y_axis].Min = y_min;
    gp.NextPlotData.YRange[y_axis].Max = y_max;
}